

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Error __thiscall asmjit::CodeEmitter::setLastError(CodeEmitter *this,Error error,char *message)

{
  long *plVar1;
  ulong uVar2;
  char *in_RDX;
  Error in_ESI;
  long in_RDI;
  ErrorHandler *handler;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  char *local_20;
  Error local_4;
  
  if (*(long *)(in_RDI + 0x18) != 0) {
    if (in_ESI == 0) {
      *(undefined4 *)(in_RDI + 0x2c) = 0;
      *(uint *)(in_RDI + 0x38) = *(uint *)(in_RDI + 0x38) & 0xfffffffe;
      local_4 = 0;
    }
    else {
      local_20 = in_RDX;
      if (in_RDX == (char *)0x0) {
        local_20 = DebugUtils::errorAsString((Error)((ulong)in_RDI >> 0x20));
      }
      plVar1 = *(long **)(*(long *)(in_RDI + 0x18) + 0x30);
      local_4 = in_ESI;
      if ((plVar1 == (long *)0x0) ||
         (uVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,in_ESI,local_20,in_RDI), (uVar2 & 1) == 0)) {
        *(Error *)(in_RDI + 0x2c) = in_ESI;
        *(uint *)(in_RDI + 0x38) = *(uint *)(in_RDI + 0x38) | 1;
      }
    }
    return local_4;
  }
  DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
}

Assistant:

Error CodeEmitter::setLastError(Error error, const char* message) {
  // This is fatal, CodeEmitter can't set error without being attached to `CodeHolder`.
  ASMJIT_ASSERT(_code != nullptr);

  // Special case used to reset the last error.
  if (error == kErrorOk) {
    _lastError = kErrorOk;
    _globalOptions &= ~kOptionMaybeFailureCase;
    return kErrorOk;
  }

  if (!message)
    message = DebugUtils::errorAsString(error);

  // Logging is skipped if the error is handled by `ErrorHandler`.
  ErrorHandler* handler = _code->_errorHandler;
  if (handler && handler->handleError(error, message, this))
    return error;

  // The handler->handleError() function may throw an exception or longjmp()
  // to terminate the execution of `setLastError()`. This is the reason why
  // we have delayed changing the `_error` member until now.
  _lastError = error;
  _globalOptions |= kOptionMaybeFailureCase;

  return error;
}